

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::TessControlExecutor
          (TessControlExecutor *this,RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  GLSLVersion version;
  bool bVar1;
  ProgramSources *pPVar2;
  char *pcVar3;
  ostream *poVar4;
  GLSLVersion version_00;
  GLSLVersion version_01;
  ShaderSpec *shaderSpec_00;
  string sStack_368;
  string local_348;
  string local_328;
  string local_308;
  undefined1 local_2e8 [40];
  undefined1 local_2c0 [40];
  undefined1 local_298 [40];
  undefined1 local_270 [376];
  ProgramSources local_f8;
  
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  generateVertexShaderForTess_abi_cxx11_
            (&local_308,(ShaderExecUtil *)(ulong)shaderSpec->version,version_00);
  glu::VertexSource::VertexSource((VertexSource *)local_298,&local_308);
  pPVar2 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_298);
  generateTessControlShader_abi_cxx11_(&local_328,(TessControlExecutor *)shaderSpec,shaderSpec_00);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_2c0,&local_328);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_2c0);
  version = shaderSpec->version;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
  pcVar3 = glu::getGLSLVersionDeclaration(version);
  poVar4 = std::operator<<((ostream *)local_270,pcVar3);
  std::operator<<(poVar4,"\n");
  bVar1 = glu::glslVersionIsES(version);
  if (bVar1 && (int)version < 3) {
    std::operator<<((ostream *)local_270,"#extension GL_EXT_tessellation_shader : require\n\n");
  }
  std::operator<<((ostream *)local_270,"layout(triangles, ccw) in;\n");
  poVar4 = std::operator<<((ostream *)local_270,"\nvoid main (void)\n{\n");
  poVar4 = std::operator<<(poVar4,"\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_2e8,&local_348);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_2e8);
  generateEmptyFragmentSource_abi_cxx11_
            (&sStack_368,(ShaderExecUtil *)(ulong)shaderSpec->version,version_01);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_270,&sStack_368);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_270);
  BufferIoExecutor::BufferIoExecutor(&this->super_BufferIoExecutor,renderCtx,shaderSpec,pPVar2);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)&sStack_368);
  std::__cxx11::string::~string((string *)(local_2e8 + 8));
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)(local_2c0 + 8));
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)(local_298 + 8));
  std::__cxx11::string::~string((string *)&local_308);
  glu::ProgramSources::~ProgramSources(&local_f8);
  (this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor =
       (_func_int **)&PTR__TessControlExecutor_00a30360;
  return;
}

Assistant:

TessControlExecutor::TessControlExecutor (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
	: BufferIoExecutor	(renderCtx, shaderSpec, glu::ProgramSources()
							<< glu::VertexSource(generateVertexShaderForTess(shaderSpec.version))
							<< glu::TessellationControlSource(generateTessControlShader(shaderSpec))
							<< glu::TessellationEvaluationSource(generateEmptyTessEvalShader(shaderSpec.version))
							<< glu::FragmentSource(generateEmptyFragmentSource(shaderSpec.version)))
{
}